

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_11.cpp
# Opt level: O0

Link * __thiscall Link::erase(Link *this)

{
  Link *this_local;
  
  if (this == (Link *)0x0) {
    this_local = (Link *)0x0;
  }
  else {
    if (this->succ != (Link *)0x0) {
      this->succ->prev = this->prev;
    }
    if (this->prev != (Link *)0x0) {
      this->prev->succ = this->succ;
    }
    this_local = this->succ;
  }
  return this_local;
}

Assistant:

Link* Link::erase()
{
	if (!this)
		return nullptr;
	if (succ)
		succ->prev = prev;
	if (prev)
		prev->succ = succ;
	return succ;
}